

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.h
# Opt level: O2

tensor * __thiscall
dlib::sgd::operator()
          (sgd *this,float learning_rate,avg_pool_<2L,_2L,_2,_2,_0,_0> *l,tensor *params_grad)

{
  uint *puVar1;
  ostream *poVar2;
  fatal_error *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar5 [64];
  undefined8 in_XMM1_Qa;
  undefined1 auVar6 [16];
  string local_1b8;
  ostringstream dlib_o_out;
  uint auStack_180 [88];
  
  auVar5._4_60_ = in_register_00001204;
  auVar5._0_4_ = learning_rate;
  if ((l->params).super_tensor.m_size != 0) {
    if ((this->v).super_tensor.m_size == 0) {
      resizable_tensor::copy_size(&this->v,params_grad);
      tensor::operator=((tensor *)this,0.0);
    }
    auVar6._0_8_ = (double)this->weight_decay;
    auVar6._8_8_ = in_XMM1_Qa;
    auVar3._12_4_ = 0x80000000;
    auVar3._0_12_ = ZEXT812(0x8000000000000000);
    auVar3 = vxorpd_avx512vl(auVar6,auVar3);
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar4 = vxorps_avx512vl(auVar5._0_16_,auVar4);
    tt::affine_transform
              ((tensor *)this,(tensor *)this,&(l->params).super_tensor,params_grad,this->momentum,
               (float)((double)learning_rate * auVar3._0_8_),auVar4._0_4_);
    return (tensor *)this;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2e);
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/solvers.h"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar2 = std::operator<<(poVar2,
                           "const tensor &dlib::sgd::operator()(const float, const layer_type &, const tensor &) [layer_type = dlib::avg_pool_<2, 2, 2, 2>]"
                          );
  std::operator<<(poVar2,".\n\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar2 = std::operator<<(poVar2,"params.size() != 0");
  std::operator<<(poVar2,".\n");
  puVar1 = (uint *)((long)auStack_180 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"");
  std::operator<<(poVar2,"\n");
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1b8);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

const tensor& operator() (
            const float learning_rate,
            const layer_type& l,
            const tensor& params_grad
        )
        {
            const tensor& params = l.get_layer_params();

            DLIB_CASSERT(params.size() != 0);
            if (v.size() == 0)
            {
                v.copy_size(params_grad);
                v = 0;
            }

            const double lr = learning_rate*get_learning_rate_multiplier(l);
            const double wd = weight_decay*get_weight_decay_multiplier(l);
            
            //perform: v = momentum*mat(v) - wd*lr*mat(params) - lr*mat(params_grad);
            tt::affine_transform(v, v, params, params_grad, momentum, -wd*lr, -lr);

            return v;
        }